

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O0

Vec_Int_t * Abc_NtkCollectEquivClasses(Abc_Ntk_t **pNtks,Gia_Man_t *pGia)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *vGia2Cla_00;
  Abc_Obj_t *pAVar4;
  uint local_60;
  int fCompl;
  int Entry;
  int k;
  int i;
  int n;
  Abc_Obj_t *pObj;
  Vec_Int_t *vNexts [2];
  Vec_Int_t *vGia2Cla;
  Vec_Int_t *vClasses;
  Vec_Int_t *vClass;
  Gia_Man_t *pGia_local;
  Abc_Ntk_t **pNtks_local;
  
  p = Vec_IntAlloc(100);
  p_00 = Vec_IntAlloc(1000);
  iVar1 = Gia_ManObjNum(pGia);
  vGia2Cla_00 = Vec_IntStartFull(iVar1);
  iVar1 = Abc_NtkObjNumMax(*pNtks);
  pObj = (Abc_Obj_t *)Vec_IntStartFull(iVar1);
  iVar1 = Abc_NtkObjNumMax(pNtks[1]);
  vNexts[0] = Vec_IntStartFull(iVar1);
  for (Entry = 0; iVar1 = Abc_NtkCiNum(*pNtks), Entry < iVar1; Entry = Entry + 1) {
    pAVar4 = Abc_NtkCi(*pNtks,Entry);
    uVar2 = Abc_ObjId(pAVar4);
    Abc_NtkCollectAddOne(0,uVar2,(pAVar4->field_6).iTemp,pGia,vGia2Cla_00,(Vec_Int_t **)&pObj);
  }
  for (k = 0; k < 2; k = k + 1) {
    for (Entry = 0; iVar1 = Vec_PtrSize(pNtks[k]->vObjs), Entry < iVar1; Entry = Entry + 1) {
      pAVar4 = Abc_NtkObj(pNtks[k],Entry);
      if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) {
        uVar2 = Abc_ObjId(pAVar4);
        Abc_NtkCollectAddOne(k,uVar2,(pAVar4->field_6).iTemp,pGia,vGia2Cla_00,(Vec_Int_t **)&pObj);
      }
    }
  }
  for (Entry = 0; iVar1 = Vec_IntSize(vGia2Cla_00), Entry < iVar1; Entry = Entry + 1) {
    local_60 = Vec_IntEntry(vGia2Cla_00,Entry);
    Vec_IntClear(p);
    for (; -1 < (int)local_60;
        local_60 = Vec_IntEntry(vNexts[(long)(int)(local_60 & 1) + -1],(int)local_60 >> 2)) {
      Vec_IntPush(p,local_60);
    }
    iVar1 = Vec_IntSize(p);
    if (1 < iVar1) {
      Vec_IntReverseOrder(p);
      uVar2 = Vec_IntEntry(p,0);
      for (fCompl = 0; iVar1 = Vec_IntSize(p), fCompl < iVar1; fCompl = fCompl + 1) {
        uVar3 = Vec_IntEntry(p,fCompl);
        Vec_IntWriteEntry(p,fCompl,uVar3 ^ uVar2 & 2);
      }
      iVar1 = Vec_IntSize(p);
      Vec_IntPush(p_00,iVar1);
      Vec_IntAppend(p_00,p);
    }
  }
  Vec_IntFree(vGia2Cla_00);
  Vec_IntFree((Vec_Int_t *)pObj);
  Vec_IntFree(vNexts[0]);
  Vec_IntFree(p);
  return p_00;
}

Assistant:

Vec_Int_t * Abc_NtkCollectEquivClasses( Abc_Ntk_t * pNtks[2], Gia_Man_t * pGia )
{
    Vec_Int_t * vClass = Vec_IntAlloc( 100 );
    Vec_Int_t * vClasses = Vec_IntAlloc( 1000 );
    Vec_Int_t * vGia2Cla = Vec_IntStartFull( Gia_ManObjNum(pGia) ); // mapping objId into classId
    Vec_Int_t * vNexts[2] = { Vec_IntStartFull(Abc_NtkObjNumMax(pNtks[0])), Vec_IntStartFull(Abc_NtkObjNumMax(pNtks[1])) };
    Abc_Obj_t * pObj;
    int n, i, k, Entry, fCompl;
    Abc_NtkForEachCi( pNtks[0], pObj, i )
        Abc_NtkCollectAddOne( 0, Abc_ObjId(pObj), pObj->iTemp, pGia, vGia2Cla, vNexts );
    for ( n = 0; n < 2; n++ )
        Abc_NtkForEachNode( pNtks[n], pObj, i )
            Abc_NtkCollectAddOne( n, Abc_ObjId(pObj), pObj->iTemp, pGia, vGia2Cla, vNexts );
    Vec_IntForEachEntry( vGia2Cla, Entry, i )
    {
        Vec_IntClear( vClass );
        for ( ; Entry >= 0; Entry = Vec_IntEntry(vNexts[Entry&1], Entry>>2) )
            Vec_IntPush( vClass, Entry );
        if ( Vec_IntSize(vClass) < 2 )
            continue;
        Vec_IntReverseOrder( vClass );
        fCompl = 2 & Vec_IntEntry( vClass, 0 );
        Vec_IntForEachEntry( vClass, Entry, k )
            Vec_IntWriteEntry( vClass, k, Entry ^ fCompl );        
        Vec_IntPush( vClasses, Vec_IntSize(vClass) );
        Vec_IntAppend( vClasses, vClass );
    }
    Vec_IntFree( vGia2Cla );
    Vec_IntFree( vNexts[0] );
    Vec_IntFree( vNexts[1] );
    Vec_IntFree( vClass );
    return vClasses;
}